

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall
level_tools::calculate_subdivisions
          (level_tools *this,size_t *vb_size,size_t *ib_size,uint32_t ogf_idx)

{
  pointer ppxVar1;
  xr_ogf *pxVar2;
  uint32_t *puVar3;
  bool bVar4;
  int iVar5;
  uint32_t eshader_idx;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t *puVar6;
  
  ppxVar1 = (this->m_subdivisions->
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)ogf_idx <
      (ulong)((long)(this->m_subdivisions->
                    super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar1 >> 3)) {
    pxVar2 = ppxVar1[ogf_idx];
    iVar5 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])
                      (pxVar2);
    if ((char)iVar5 == '\0') {
      eshader_idx = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                      [0x1e])(pxVar2);
      bVar4 = is_compiled_wallmark(this,eshader_idx);
      if (!bVar4) {
        iVar5 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                          (pxVar2);
        *vb_size = *vb_size + *(long *)(CONCAT44(extraout_var,iVar5) + 0x10);
        iVar5 = (*(pxVar2->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                          (pxVar2);
        *ib_size = *ib_size + *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x10);
      }
    }
    else {
      puVar3 = (pxVar2->m_children_l).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar6 = (pxVar2->m_children_l).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1) {
        calculate_subdivisions(this,vb_size,ib_size,*puVar6);
      }
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void level_tools::calculate_subdivisions(size_t& vb_size, size_t& ib_size, uint32_t ogf_idx) const
{
	const xr_ogf* ogf = m_subdivisions->at(ogf_idx);
	if (ogf->hierarchical()) {
		for (std::vector<uint32_t>::const_iterator it = ogf->children_l().begin(),
				end = ogf->children_l().end(); it != end; ++it) {
			calculate_subdivisions(vb_size, ib_size, *it);
		}
	} else if (is_compiled_wallmark(ogf->shader_l())) {
		// FIXME: this might be useful to restore wallmarks
		// even if there is no redundant level.wallmarks
	} else {
		vb_size += ogf->vb().size();
		ib_size += ogf->ib().size();
	}
}